

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall
HEkk::initialiseCost(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  double dVar1;
  bool bVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double dVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  initialiseLpColCost(this);
  lVar9 = (long)(this->lp_).num_row_;
  if (0 < lVar9) {
    lVar11 = (long)(this->lp_).num_col_;
    lVar9 = lVar9 + lVar11;
    pdVar3 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pdVar3[lVar11] = 0.0;
      pdVar4[lVar11] = 0.0;
      lVar11 = lVar11 + 1;
    } while (lVar11 < lVar9);
  }
  (this->info_).costs_shifted = false;
  (this->info_).costs_perturbed = false;
  (this->analysis_).net_num_single_cost_shift = 0;
  if (!perturb || algorithm == kPrimal) {
    return;
  }
  dVar17 = (this->info_).dual_simplex_cost_perturbation_multiplier;
  if ((dVar17 == 0.0) && (!NAN(dVar17))) {
    return;
  }
  bVar2 = (this->options_->super_HighsOptionsStruct).output_flag;
  if (bVar2 == true) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "Cost perturbation for %s\n",(this->lp_).model_name_._M_dataplus._M_p);
  }
  iVar14 = (this->lp_).num_col_;
  if ((long)iVar14 < 1) {
    uVar12 = 0;
    dVar16 = INFINITY;
    dVar17 = 0.0;
    dVar18 = 0.0;
  }
  else {
    lVar9 = 0;
    uVar12 = 0;
    dVar18 = 0.0;
    dVar17 = 0.0;
    dVar19 = INFINITY;
    do {
      dVar1 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      dVar7 = ABS(dVar1);
      dVar16 = dVar19;
      if (bVar2 != false) {
        if (((dVar1 != 0.0) || (NAN(dVar1))) &&
           (uVar12 = uVar12 + 1, dVar16 = dVar7, dVar19 <= dVar7)) {
          dVar16 = dVar19;
        }
        dVar18 = dVar18 + dVar7;
      }
      if (dVar7 <= dVar17) {
        dVar7 = dVar17;
      }
      dVar17 = dVar7;
      lVar9 = lVar9 + 1;
      dVar19 = dVar16;
    } while (iVar14 != lVar9);
  }
  if (bVar2 == false) {
LAB_0033dbd9:
    if (100.0 < dVar17) {
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      if (dVar17 < 0.0) {
        dVar17 = sqrt(dVar17);
      }
      else {
        dVar17 = SQRT(dVar17);
      }
      if (bVar2 != false) {
        highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                    "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n",dVar17);
      }
    }
  }
  else {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "   Initially have %d nonzero costs (%3d%%)",(ulong)uVar12,
                (long)(int)(uVar12 * 100) / (long)iVar14 & 0xffffffff);
    if (uVar12 != 0) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                  " with min / average / max = %g / %g / %g\n",dVar16,dVar18 / (double)(int)uVar12,
                  dVar17);
      goto LAB_0033dbd9;
    }
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                " but perturb as if max cost was 1\n");
    dVar17 = 1.0;
  }
  uVar10 = (ulong)(this->lp_).num_col_;
  uVar15 = (long)(this->lp_).num_row_ + uVar10;
  iVar14 = (int)uVar15;
  if (iVar14 < 1) {
    dVar16 = 0.0;
  }
  else {
    dVar16 = 0.0;
    uVar13 = 0;
    do {
      dVar16 = dVar16 + (double)(-(ulong)((this->info_).workRange_.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar13] < 1e+30)
                                & 0x3ff0000000000000);
      uVar13 = uVar13 + 1;
    } while ((uVar15 & 0xffffffff) != uVar13);
  }
  if (0.01 <= dVar16 / (double)iVar14) {
    this->cost_perturbation_max_abs_cost_ = dVar17;
    this->cost_perturbation_base_ =
         (this->info_).dual_simplex_cost_perturbation_multiplier * 5e-07 * dVar17;
    if (bVar2 == false) goto LAB_0033ddc9;
  }
  else {
    dVar16 = 1.0;
    if (dVar17 <= 1.0) {
      dVar16 = dVar17;
    }
    if (bVar2 == false) {
      this->cost_perturbation_max_abs_cost_ = dVar16;
      this->cost_perturbation_base_ =
           (this->info_).dual_simplex_cost_perturbation_multiplier * 5e-07 * dVar16;
      goto LAB_0033ddc9;
    }
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "   Small boxedRate (%g) so set max_abs_cost = min(max_abs_cost, 1.0) = %g\n");
    this->cost_perturbation_max_abs_cost_ = dVar16;
    this->cost_perturbation_base_ =
         (this->info_).dual_simplex_cost_perturbation_multiplier * 5e-07 * dVar16;
  }
  highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
              "   Perturbation column base = %g\n");
  uVar10 = (ulong)(uint)(this->lp_).num_col_;
LAB_0033ddc9:
  iVar8 = (int)uVar10;
  if (0 < iVar8) {
    pdVar3 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      dVar17 = pdVar3[uVar13];
      dVar16 = pdVar4[uVar13];
      dVar18 = pdVar6[uVar13];
      dVar19 = (ABS(dVar18) + 1.0) * (pdVar5[uVar13] + 1.0) * this->cost_perturbation_base_;
      if ((-INFINITY < dVar17) || (dVar16 < INFINITY)) {
        if (dVar16 < INFINITY) {
          if (-INFINITY < dVar17) {
            if ((dVar17 == dVar16) && (!NAN(dVar17) && !NAN(dVar16))) goto LAB_0033dea8;
            dVar18 = dVar18 + (double)(~-(ulong)(0.0 <= dVar18) & (ulong)-dVar19 |
                                      -(ulong)(0.0 <= dVar18) & (ulong)dVar19);
          }
          else {
            dVar18 = dVar18 - dVar19;
          }
        }
        else {
          dVar18 = dVar18 + dVar19;
        }
        pdVar6[uVar13] = dVar18;
      }
LAB_0033dea8:
      uVar13 = uVar13 + 1;
    } while ((uVar10 & 0xffffffff) != uVar13);
  }
  dVar17 = (this->info_).dual_simplex_cost_perturbation_multiplier;
  if (bVar2 != false) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                "   Perturbation row    base = %g\n");
    iVar8 = (this->lp_).num_col_;
  }
  if (iVar8 < iVar14) {
    pdVar3 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)iVar8;
    do {
      pdVar3[uVar10] = (0.5 - pdVar4[uVar10]) * dVar17 * 1e-12 + pdVar3[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
  }
  (this->info_).costs_perturbed = true;
  return;
}

Assistant:

void HEkk::initialiseCost(const SimplexAlgorithm algorithm,
                          const HighsInt solve_phase, const bool perturb) {
  // Copy the cost
  initialiseLpColCost();
  initialiseLpRowCost();
  info_.costs_shifted = false;
  info_.costs_perturbed = false;
  analysis_.net_num_single_cost_shift = 0;
  // Primal simplex costs are either from the LP or set specially in phase 1
  if (algorithm == SimplexAlgorithm::kPrimal) return;
  // Dual simplex costs are either from the LP or perturbed
  if (!perturb || info_.dual_simplex_cost_perturbation_multiplier == 0) return;
  // Perturb the original costs, scale down if is too big
  const bool report_cost_perturbation =
      options_->output_flag;  // && analysis_.analyse_simplex_runtime_data;
  HighsInt num_original_nonzero_cost = 0;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "Cost perturbation for %s\n", lp_.model_name_.c_str());
  double min_abs_cost = kHighsInf;
  double max_abs_cost = 0;
  double sum_abs_cost = 0;
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    const double abs_cost = fabs(info_.workCost_[i]);
    if (report_cost_perturbation) {
      if (abs_cost) {
        num_original_nonzero_cost++;
        min_abs_cost = min(min_abs_cost, abs_cost);
      }
      sum_abs_cost += abs_cost;
    }
    max_abs_cost = max(max_abs_cost, abs_cost);
  }
  const HighsInt pct0 = (100 * num_original_nonzero_cost) / lp_.num_col_;
  double average_abs_cost = 0;
  if (report_cost_perturbation) {
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Initially have %" HIGHSINT_FORMAT
                " nonzero costs (%3" HIGHSINT_FORMAT "%%)",
                num_original_nonzero_cost, pct0);
    if (num_original_nonzero_cost) {
      average_abs_cost = sum_abs_cost / num_original_nonzero_cost;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " with min / average / max = %g / %g / %g\n", min_abs_cost,
                  average_abs_cost, max_abs_cost);
    } else {
      min_abs_cost = 1.0;
      max_abs_cost = 1.0;
      average_abs_cost = 1.0;
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  " but perturb as if max cost was 1\n");
    }
  }
  if (max_abs_cost > 100) {
    max_abs_cost = sqrt(sqrt(max_abs_cost));
    if (report_cost_perturbation)
      highsLogDev(
          options_->log_options, HighsLogType::kInfo,
          "   Large so set max_abs_cost = sqrt(sqrt(max_abs_cost)) = %g\n",
          max_abs_cost);
  }

  // If there are few boxed variables, we will just use simple perturbation
  double boxedRate = 0;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt i = 0; i < num_tot; i++)
    boxedRate += (info_.workRange_[i] < 1e30);
  boxedRate /= num_tot;
  if (boxedRate < 0.01) {
    max_abs_cost = min(max_abs_cost, 1.0);
    if (report_cost_perturbation)
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "   Small boxedRate (%g) so set max_abs_cost = "
                  "min(max_abs_cost, 1.0) = "
                  "%g\n",
                  boxedRate, max_abs_cost);
  }
  // Determine the perturbation base
  cost_perturbation_max_abs_cost_ = max_abs_cost;
  cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 5e-7 * max_abs_cost;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation column base = %g\n", cost_perturbation_base_);

  // Now do the perturbation
  for (HighsInt i = 0; i < lp_.num_col_; i++) {
    double lower = lp_.col_lower_[i];
    double upper = lp_.col_upper_[i];
    double xpert = (1 + info_.numTotRandomValue_[i]) *
                   (fabs(info_.workCost_[i]) + 1) * cost_perturbation_base_;
    // const double previous_cost = info_.workCost_[i];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free - no perturb
    } else if (upper >= kHighsInf) {  // Lower
      info_.workCost_[i] += xpert;
    } else if (lower <= -kHighsInf) {  // Upper
      info_.workCost_[i] += -xpert;
    } else if (lower != upper) {  // Boxed
      info_.workCost_[i] += (info_.workCost_[i] >= 0) ? xpert : -xpert;
    } else {
      // Fixed - no perturb
    }
    //    if (report_cost_perturbation) {
    //      const double perturbation1 = fabs(info_.workCost_[i] -
    //      previous_cost); if (perturbation1)
    //        updateValueDistribution(perturbation1,
    //                                analysis_.cost_perturbation1_distribution);
    //    }
  }
  const double row_cost_perturbation_base_ =
      info_.dual_simplex_cost_perturbation_multiplier * 1e-12;
  if (report_cost_perturbation)
    highsLogDev(options_->log_options, HighsLogType::kInfo,
                "   Perturbation row    base = %g\n",
                row_cost_perturbation_base_);
  for (HighsInt i = lp_.num_col_; i < num_tot; i++) {
    double perturbation2 =
        (0.5 - info_.numTotRandomValue_[i]) * row_cost_perturbation_base_;
    info_.workCost_[i] += perturbation2;
    //    if (report_cost_perturbation) {
    //      perturbation2 = fabs(perturbation2);
    //      updateValueDistribution(perturbation2,
    //                              analysis_.cost_perturbation2_distribution);
    //    }
  }
  info_.costs_perturbed = true;
}